

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

RandomBernoulliStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randombernoullistatic(NeuralNetworkLayer *this)

{
  RandomBernoulliStaticLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x4bf) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4bf;
    this_00 = (RandomBernoulliStaticLayerParams *)operator_new(0x38);
    RandomBernoulliStaticLayerParams::RandomBernoulliStaticLayerParams(this_00);
    (this->layer_).randombernoullistatic_ = this_00;
  }
  return (RandomBernoulliStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomBernoulliStaticLayerParams* NeuralNetworkLayer::mutable_randombernoullistatic() {
  if (!has_randombernoullistatic()) {
    clear_layer();
    set_has_randombernoullistatic();
    layer_.randombernoullistatic_ = new ::CoreML::Specification::RandomBernoulliStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomBernoulliStatic)
  return layer_.randombernoullistatic_;
}